

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O2

string * __thiscall
flatbuffers::anon_unknown_25::LuaBfbsGenerator::RegisterRequires
          (string *__return_storage_ptr__,LuaBfbsGenerator *this,string *param_1,
          string *requires_name)

{
  mapped_type *pmVar1;
  
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->requires_,param_1);
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)param_1);
  return __return_storage_ptr__;
}

Assistant:

std::string RegisterRequires(const std::string &local_name,
                               const std::string &requires_name) {
    requires_[local_name] = requires_name;
    return local_name;
  }